

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configset.hh
# Opt level: O0

list<bool,_std::allocator<bool>_> * __thiscall
utilmm::config_set::get<std::__cxx11::list<bool,std::allocator<bool>>>
          (list<bool,_std::allocator<bool>_> *__return_storage_ptr__,config_set *this,string *name,
          list<bool,_std::allocator<bool>_> *defval,type *enabler)

{
  bool bVar1;
  reference pbVar2;
  value_type_conflict1 local_a1;
  iterator local_a0;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  iterator local_90;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  const_iterator it;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined1 local_48 [8];
  stringlist values;
  type *enabler_local;
  list<bool,_std::allocator<bool>_> *defval_local;
  string *name_local;
  config_set *this_local;
  list<bool,_std::allocator<bool>_> *result;
  
  local_68.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_68.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_68.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  values.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)enabler;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&local_68);
  utilmm::config_set::
  get<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)local_48,(list_conflict *)this,(type *)name);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list(&local_68);
  bVar1 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48);
  if (bVar1) {
    std::__cxx11::list<bool,_std::allocator<bool>_>::list(__return_storage_ptr__,defval);
  }
  else {
    it._M_node._7_1_ = 0;
    std::__cxx11::list<bool,_std::allocator<bool>_>::list(__return_storage_ptr__);
    local_90._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_88,&local_90);
    while( true ) {
      local_a0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_List_const_iterator(&local_98,&local_a0);
      bVar1 = std::operator!=(&local_88,&local_98);
      if (!bVar1) break;
      pbVar2 = std::
               _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_88);
      local_a1 = utilmm::config_set::convert<bool>((string *)pbVar2);
      std::__cxx11::list<bool,_std::allocator<bool>_>::push_back(__return_storage_ptr__,&local_a1);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_88);
    }
    it._M_node._7_1_ = 1;
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_48);
  return __return_storage_ptr__;
}

Assistant:

T config_set::get(std::string const& name, T const& defval,
            typename boost::enable_if< details::is_list<T> >::type *enabler) const
    {
        stringlist values = get< stringlist >(name);
        if (values.empty())
            return defval;

        T result;
        for (stringlist::const_iterator it = values.begin(); it != values.end(); ++it)
            result.push_back(convert<typename T::value_type>(*it));

        return result;
    }